

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

Gia_Man_t * Jf_ManDeriveCnfMiter(Gia_Man_t *p,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  Jf_Par_t local_128;
  
  memset(&local_128,0,0x108);
  local_128.nLutSize = 6;
  local_128.nCutNum = 8;
  local_128.nRounds = 1;
  local_128.nVerbLimit = 5;
  local_128.DelayTarget = -1;
  local_128.fAreaOnly = 1;
  local_128.fOptEdge = 1;
  local_128.fPureAig = 0;
  local_128.fVeryVerbose = 0;
  local_128.fCoarsen = 0;
  local_128.fCutMin = 0;
  local_128.nLutSizeMax = 8;
  local_128.nCutNumMax = 0x10;
  local_128.fFuncDsd = 0;
  local_128.fGenCnf = 1;
  local_128.fCnfObjIds = 0;
  local_128.fAddOrCla = 1;
  local_128.fVerbose = fVerbose;
  pGVar1 = Jf_ManPerformMapping(p,&local_128);
  return pGVar1;
}

Assistant:

Gia_Man_t * Jf_ManDeriveCnfMiter( Gia_Man_t * p, int fVerbose )
{
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->fGenCnf = 1;
    pPars->fCnfObjIds = 0;
    pPars->fAddOrCla = 1;
    pPars->fVerbose = fVerbose;
    return Jf_ManPerformMapping( p, pPars );
}